

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ds_list.c
# Opt level: O0

DsListIter * ds_list_iter_create(DsList *list)

{
  DsListEntry *pDVar1;
  DsListIter *iter;
  DsList *list_local;
  
  if (list == (DsList *)0x0) {
    list_local = (DsList *)0x0;
  }
  else {
    list_local = (DsList *)malloc(0x20);
    if (list_local == (DsList *)0x0) {
      exit(2);
    }
    pDVar1 = (DsListEntry *)malloc(0x18);
    list_local->entry = pDVar1;
    if (list_local->entry == (DsListEntry *)0x0) {
      exit(2);
    }
    list_local->entry->data = (void *)0x0;
    list_local->entry->prev = (DsListEntry *)0x0;
    list_local->entry->next = list->entry;
    list_local->size = (size_t)list_local->entry;
    list_local->equal = (_func_DS_BOOL_void_ptr_void_ptr *)list->size;
    *(undefined4 *)&list_local[1].entry = 0xffffffff;
  }
  return (DsListIter *)list_local;
}

Assistant:

DsListIter *ds_list_iter_create(DsList *list)
{
    if (NULL == list)
        return NULL;
    DsListIter *iter = (DsListIter *)malloc(sizeof(DsListIter));
    if (NULL == iter)
        exit(DS_STATUS_OUTMEM);
    iter->head = (DsListEntry *)malloc(sizeof(DsListEntry));
    if (NULL == iter->head)
        exit(DS_STATUS_OUTMEM);
    iter->head->data = NULL;
    iter->head->prev = NULL;
    iter->head->next = list->entry;
    iter->curr = iter->head;
    iter->size = list->size;
    iter->index = -1;
    return iter;
}